

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v1.cpp
# Opt level: O2

int __thiscall
LASwriteItemCompressed_WAVEPACKET13_v1::init
          (LASwriteItemCompressed_WAVEPACKET13_v1 *this,EVP_PKEY_CTX *ctx)

{
  U8 *pUVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  
  this->last_diff_32 = 0;
  this->sym_last_offset_diff = 0;
  ArithmeticEncoder::initSymbolModel(this->enc,this->m_packet_index,(U32 *)0x0);
  ArithmeticEncoder::initSymbolModel(this->enc,this->m_offset_diff[0],(U32 *)0x0);
  ArithmeticEncoder::initSymbolModel(this->enc,this->m_offset_diff[1],(U32 *)0x0);
  ArithmeticEncoder::initSymbolModel(this->enc,this->m_offset_diff[2],(U32 *)0x0);
  ArithmeticEncoder::initSymbolModel(this->enc,this->m_offset_diff[3],(U32 *)0x0);
  IntegerCompressor::initCompressor(this->ic_offset_diff);
  IntegerCompressor::initCompressor(this->ic_packet_size);
  IntegerCompressor::initCompressor(this->ic_return_point);
  IntegerCompressor::initCompressor(this->ic_xyz);
  pUVar1 = this->last_item;
  uVar2 = *(undefined8 *)(ctx + 1);
  uVar3 = *(undefined8 *)(ctx + 9);
  uVar4 = *(undefined8 *)(ctx + 0x15);
  *(undefined8 *)(pUVar1 + 0xc) = *(undefined8 *)(ctx + 0xd);
  *(undefined8 *)(pUVar1 + 0x14) = uVar4;
  *(undefined8 *)pUVar1 = uVar2;
  *(undefined8 *)(pUVar1 + 8) = uVar3;
  return (int)CONCAT71((int7)((ulong)pUVar1 >> 8),1);
}

Assistant:

BOOL LASwriteItemCompressed_WAVEPACKET13_v1::init(const U8* item, U32& context)
{
  /* init state */
  last_diff_32 = 0;
  sym_last_offset_diff = 0;

  /* init models and integer compressors */
  enc->initSymbolModel(m_packet_index);
  enc->initSymbolModel(m_offset_diff[0]);
  enc->initSymbolModel(m_offset_diff[1]);
  enc->initSymbolModel(m_offset_diff[2]);
  enc->initSymbolModel(m_offset_diff[3]);
  ic_offset_diff->initCompressor();
  ic_packet_size->initCompressor();
  ic_return_point->initCompressor();
  ic_xyz->initCompressor();

  /* init last item */
  item++;
  memcpy(last_item, item, 28);
  return TRUE;
}